

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vacuum_info.cpp
# Opt level: O1

unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> __thiscall
duckdb::VacuumInfo::Copy(VacuumInfo *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  TableRef *in_RAX;
  VacuumInfo *this_00;
  pointer pVVar4;
  pointer pTVar5;
  pointer *__ptr_2;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  this_00 = (VacuumInfo *)operator_new(0x38);
  VacuumInfo(this_00,*(VacuumOptions *)(in_RSI + 9));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)this_00;
  bVar1 = *(bool *)(in_RSI + 0x28);
  pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)this);
  pVVar4->has_table = bVar1;
  if (*(char *)(in_RSI + 0x28) == '\x01') {
    pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *
                        )(in_RSI + 0x30));
    (*pTVar5->_vptr_TableRef[4])(&local_28,pTVar5);
    pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator->((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                         *)this);
    _Var3._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (TableRef *)0x0;
    _Var2._M_head_impl =
         (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (local_28._M_head_impl != (TableRef *)0x0) {
      (*(local_28._M_head_impl)->_vptr_TableRef[1])();
    }
  }
  pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pVVar4->columns,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RSI + 0x10));
  return (unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>)
         (unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>)this;
}

Assistant:

unique_ptr<VacuumInfo> VacuumInfo::Copy() {
	auto result = make_uniq<VacuumInfo>(options);
	result->has_table = has_table;
	if (has_table) {
		result->ref = ref->Copy();
	}
	result->columns = columns;
	return result;
}